

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_reader_suite.cpp
# Opt level: O2

void string_suite::string_missing_quote(void)

{
  bool bVar1;
  undefined4 local_164;
  view_type local_160;
  chunk_reader reader;
  
  trial::protocol::json::basic_reader<char>::basic_reader(&reader.super_basic_reader<char>);
  local_160._M_len = 1;
  local_160._M_str = "\"";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next
                    ((basic_chunk_reader<char> *)&reader.super_basic_reader<char>,&local_160);
  boost::detail::test_impl
            ("!reader.next(\"\\\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x19,"void string_suite::string_missing_quote()",!bVar1);
  local_160._M_len =
       CONCAT44(local_160._M_len._4_4_,reader.super_basic_reader<char>.decoder.current.code);
  local_164 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x1a,"void string_suite::string_missing_quote()",&local_160,&local_164);
  local_160._M_len = 2;
  local_160._M_str = "\"a";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::next(&reader,&local_160);
  boost::detail::test_impl
            ("!reader.next(\"\\\"a\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x1b,"void string_suite::string_missing_quote()",!bVar1);
  local_160._M_len =
       CONCAT44(local_160._M_len._4_4_,reader.super_basic_reader<char>.decoder.current.code);
  local_164 = 1;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::uninitialized",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x1c,"void string_suite::string_missing_quote()",&local_160,&local_164);
  local_160._M_len = 3;
  local_160._M_str = "\"a\"";
  bVar1 = trial::protocol::json::basic_chunk_reader<char>::finish(&reader,&local_160);
  boost::detail::test_impl
            ("reader.finish(\"\\\"a\\\"\")",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x1d,"void string_suite::string_missing_quote()",bVar1);
  local_160._M_len =
       CONCAT44(local_160._M_len._4_4_,reader.super_basic_reader<char>.decoder.current.code);
  local_164 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/chunk_reader_suite.cpp"
             ,0x1e,"void string_suite::string_missing_quote()",&local_160,&local_164);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&reader.super_basic_reader<char>.stack);
  return;
}

Assistant:

void string_missing_quote()
{
    json::chunk_reader reader;
    TRIAL_PROTOCOL_TEST(!reader.next("\""));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized);
    TRIAL_PROTOCOL_TEST(!reader.next("\"a"));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::uninitialized);
    TRIAL_PROTOCOL_TEST(reader.finish("\"a\""));
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
}